

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O1

bool tinyusdz::value::Lerp(Value *a,Value *b,double dt,Value *dst)

{
  vtable_type *pvVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  bool bVar5;
  half hVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  half2 hVar9;
  texcoord2h tVar10;
  half3 hVar11;
  point3h pVar12;
  vector3h vVar13;
  color3h cVar14;
  normal3h nVar15;
  texcoord3h tVar16;
  half *a_00;
  half *b_00;
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *a_01;
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *b_01;
  point3d *ppVar17;
  point3d *ppVar18;
  vector3f *a_02;
  vector3f *b_02;
  texcoord2f *ptVar19;
  texcoord2f *ptVar20;
  array<double,_2UL> *paVar21;
  array<double,_2UL> *paVar22;
  quatf *a_03;
  quatf *b_03;
  color4f *a_04;
  color4f *b_04;
  vector3d *pvVar23;
  vector3d *pvVar24;
  array<tinyusdz::value::half,_4UL> *a_05;
  array<tinyusdz::value::half,_4UL> *b_05;
  normal3d *pnVar25;
  normal3d *pnVar26;
  array<float,_2UL> *paVar27;
  array<float,_2UL> *paVar28;
  array<double,_3UL> *paVar29;
  array<double,_3UL> *paVar30;
  quath *this;
  quath *a_06;
  float *pfVar31;
  float *pfVar32;
  double *pdVar33;
  double *pdVar34;
  tinyusdz *ptVar35;
  array<double,_4UL> *a_07;
  array<tinyusdz::value::half,_2UL> *a_08;
  array<tinyusdz::value::half,_2UL> *b_06;
  array<tinyusdz::value::half,_3UL> *a_09;
  array<tinyusdz::value::half,_3UL> *b_07;
  normal3f *a_10;
  normal3f *b_08;
  texcoord2h *a_11;
  texcoord2h *b_09;
  array<float,_4UL> *a_12;
  array<float,_4UL> *b_10;
  point3h *a_13;
  point3h *b_11;
  point3f *a_14;
  point3f *b_12;
  array<float,_3UL> *a_15;
  array<float,_3UL> *b_13;
  quatd *a_16;
  quatd *b_14;
  color3d *pcVar36;
  color3d *pcVar37;
  vector3h *a_17;
  vector3h *b_15;
  color4d *a_18;
  color4d *b_16;
  color4h *a_19;
  color4h *b_17;
  color3h *a_20;
  color3h *b_18;
  color3f *a_21;
  color3f *b_19;
  normal3h *a_22;
  normal3h *b_20;
  vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> *a_23;
  vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> *b_21;
  vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *a_24;
  vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *b_22;
  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *a_25;
  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *b_23;
  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> *a_26;
  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> *b_24;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *a_27;
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *a_28;
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *b_25;
  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *a_29;
  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *b_26;
  vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *a_30;
  vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *b_27;
  vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
  *a_31;
  vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *a_32;
  vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *b_28;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *a_33;
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *a_34;
  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *a_35;
  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *b_29;
  vector<float,_std::allocator<float>_> *a_36;
  vector<float,_std::allocator<float>_> *b_30;
  vector<double,_std::allocator<double>_> *a_37;
  vector<double,_std::allocator<double>_> *b_31;
  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *a_38;
  vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
  *a_39;
  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  *a_40;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *a_41;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *b_32;
  vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_> *a_42;
  vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_> *b_33;
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *a_43;
  vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *a_44;
  vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *b_34;
  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *a_45;
  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *b_35;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *a_46;
  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *a_47;
  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *b_36;
  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *a_48;
  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *b_37;
  vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *a_49;
  vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *b_38;
  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *a_50;
  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *b_39;
  vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *a_51;
  vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *b_40;
  vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> *a_52;
  vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> *b_41;
  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *a_53;
  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *b_42;
  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *a_54;
  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *b_43;
  texcoord2d *ptVar38;
  texcoord2d *ptVar39;
  texcoord3f *a_55;
  texcoord3f *b_44;
  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *a_56;
  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *b_45;
  texcoord3d *ptVar40;
  texcoord3d *ptVar41;
  texcoord3h *a_57;
  texcoord3h *b_46;
  vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_> *a_58;
  vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_> *b_47;
  vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> *a_59;
  vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> *b_48;
  uint *puVar42;
  quath *b_49;
  bool bVar43;
  float3 fVar44;
  half c;
  Value result;
  color4d local_88;
  double local_60;
  vector<double,_std::allocator<double>_> local_58;
  storage_union local_40;
  undefined **local_30;
  
  if (dst == (Value *)0x0) {
    return false;
  }
  pvVar1 = (a->v_).vtable;
  uVar8 = 2;
  uVar7 = 2;
  local_60 = dt;
  if (pvVar1 != (vtable_type *)0x0) {
    uVar7 = (*pvVar1->type_id)();
  }
  pvVar1 = (b->v_).vtable;
  if (pvVar1 != (vtable_type *)0x0) {
    uVar8 = (*pvVar1->type_id)();
  }
  if (uVar7 != uVar8) {
    return false;
  }
  pvVar1 = (a->v_).vtable;
  if (pvVar1 == (vtable_type *)0x0) {
    uVar7 = 2;
  }
  else {
    uVar7 = (*pvVar1->type_id)();
  }
  bVar5 = IsLerpSupportedType(uVar7);
  if (!bVar5) {
    return false;
  }
  local_30 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_40.dynamic = (void *)0x0;
  puVar42 = &switchD_002c4cae::switchdataD_00435c28;
  switch(uVar7) {
  case 0xe:
    a_00 = Value::as<tinyusdz::value::half>(a,false);
    b_00 = Value::as<tinyusdz::value::half>(b,false);
    bVar5 = b_00 != (half *)0x0 && a_00 != (half *)0x0;
    if (b_00 != (half *)0x0 && a_00 != (half *)0x0) {
      hVar6 = lerp<tinyusdz::value::half>(a_00,b_00,local_60);
      local_88.r._0_2_ = hVar6.value;
      linb::any::operator=((any *)&local_40,(half *)&local_88);
    }
    break;
  case 0xf:
  case 0x10:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x48:
LAB_002c726f:
    switch(uVar7) {
    case 0x4b:
      ptVar38 = Value::as<tinyusdz::value::texcoord2d>(a,false);
      ptVar39 = Value::as<tinyusdz::value::texcoord2d>(b,false);
      bVar5 = ptVar39 != (texcoord2d *)0x0 && ptVar38 != (texcoord2d *)0x0;
      if (ptVar39 != (texcoord2d *)0x0 && ptVar38 != (texcoord2d *)0x0) {
        local_88.g = local_60 * ptVar39->t + (1.0 - local_60) * ptVar38->t;
        local_88.r = ptVar39->s * local_60 + ptVar38->s * (1.0 - local_60);
        linb::any::operator=((any *)&local_40,(texcoord2d *)&local_88);
      }
      break;
    case 0x4c:
      a_57 = Value::as<tinyusdz::value::texcoord3h>(a,false);
      b_46 = Value::as<tinyusdz::value::texcoord3h>(b,false);
      bVar5 = b_46 != (texcoord3h *)0x0 && a_57 != (texcoord3h *)0x0;
      if (b_46 != (texcoord3h *)0x0 && a_57 != (texcoord3h *)0x0) {
        tVar16 = lerp<tinyusdz::value::texcoord3h>(a_57,b_46,local_60);
        local_88.r._0_6_ = (color3h)tVar16;
        linb::any::operator=((any *)&local_40,(texcoord3h *)&local_88);
      }
      break;
    case 0x4d:
      a_55 = Value::as<tinyusdz::value::texcoord3f>(a,false);
      b_44 = Value::as<tinyusdz::value::texcoord3f>(b,false);
      bVar5 = b_44 != (texcoord3f *)0x0 && a_55 != (texcoord3f *)0x0;
      if (b_44 != (texcoord3f *)0x0 && a_55 != (texcoord3f *)0x0) {
        local_88._0_12_ = lerp<tinyusdz::value::texcoord3f>(a_55,b_44,local_60);
        linb::any::operator=((any *)&local_40,(texcoord3f *)&local_88);
      }
      break;
    case 0x4e:
      ptVar40 = Value::as<tinyusdz::value::texcoord3d>(a,false);
      ptVar41 = Value::as<tinyusdz::value::texcoord3d>(b,false);
      bVar5 = ptVar41 != (texcoord3d *)0x0 && ptVar40 != (texcoord3d *)0x0;
      if (ptVar41 != (texcoord3d *)0x0 && ptVar40 != (texcoord3d *)0x0) {
        dVar2 = 1.0 - local_60;
        local_88.b = local_60 * ptVar41->r + dVar2 * ptVar40->r;
        local_88.g = ptVar41->t * local_60 + ptVar40->t * dVar2;
        local_88.r = ptVar41->s * local_60 + ptVar40->s * dVar2;
        linb::any::operator=((any *)&local_40,(texcoord3d *)&local_88);
      }
      break;
    default:
      switch(uVar7) {
      case 0x10004b:
        a_23 = Value::
               as<std::vector<tinyusdz::value::texcoord2d,std::allocator<tinyusdz::value::texcoord2d>>>
                         (a,false);
        b_21 = Value::
               as<std::vector<tinyusdz::value::texcoord2d,std::allocator<tinyusdz::value::texcoord2d>>>
                         (b,false);
        local_88._0_16_ = ZEXT816(0);
        local_88.b = 0.0;
        bVar5 = b_21 != (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                         *)0x0 &&
                a_23 != (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                         *)0x0;
        if (b_21 != (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                     *)0x0 &&
            a_23 != (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                     *)0x0) {
          lerp<tinyusdz::value::texcoord2d>
                    ((vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                      *)&local_58,a_23,b_21,local_60);
          dVar4 = local_88.b;
          dVar2 = local_88.r;
          local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish;
          local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start;
          local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage;
          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if ((color4h)dVar2 != (color4h)0x0) {
            operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
          }
          if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_58.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_58.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          linb::any::operator=
                    ((any *)&local_40,
                     (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                      *)&local_88);
        }
        break;
      case 0x10004c:
        a_59 = Value::
               as<std::vector<tinyusdz::value::texcoord3h,std::allocator<tinyusdz::value::texcoord3h>>>
                         (a,false);
        b_48 = Value::
               as<std::vector<tinyusdz::value::texcoord3h,std::allocator<tinyusdz::value::texcoord3h>>>
                         (b,false);
        local_88._0_16_ = ZEXT816(0);
        local_88.b = 0.0;
        bVar5 = b_48 != (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                         *)0x0 &&
                a_59 != (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                         *)0x0;
        if (b_48 != (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                     *)0x0 &&
            a_59 != (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                     *)0x0) {
          lerp<tinyusdz::value::texcoord3h>
                    ((vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                      *)&local_58,a_59,b_48,local_60);
          dVar4 = local_88.b;
          dVar2 = local_88.r;
          local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish;
          local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start;
          local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage;
          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if ((color4h)dVar2 != (color4h)0x0) {
            operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
          }
          if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_58.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_58.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          linb::any::operator=
                    ((any *)&local_40,
                     (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                      *)&local_88);
        }
        break;
      case 0x10004d:
        a_56 = Value::
               as<std::vector<tinyusdz::value::texcoord3f,std::allocator<tinyusdz::value::texcoord3f>>>
                         (a,false);
        b_45 = Value::
               as<std::vector<tinyusdz::value::texcoord3f,std::allocator<tinyusdz::value::texcoord3f>>>
                         (b,false);
        local_88._0_16_ = ZEXT816(0);
        local_88.b = 0.0;
        bVar5 = b_45 != (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                         *)0x0 &&
                a_56 != (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                         *)0x0;
        if (b_45 != (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                     *)0x0 &&
            a_56 != (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                     *)0x0) {
          lerp<tinyusdz::value::texcoord3f>
                    ((vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                      *)&local_58,a_56,b_45,local_60);
          dVar4 = local_88.b;
          dVar2 = local_88.r;
          local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish;
          local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start;
          local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage;
          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if ((color4h)dVar2 != (color4h)0x0) {
            operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
          }
          if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_58.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_58.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          linb::any::operator=
                    ((any *)&local_40,
                     (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                      *)&local_88);
        }
        break;
      case 0x10004e:
        a_58 = Value::
               as<std::vector<tinyusdz::value::texcoord3d,std::allocator<tinyusdz::value::texcoord3d>>>
                         (a,false);
        b_47 = Value::
               as<std::vector<tinyusdz::value::texcoord3d,std::allocator<tinyusdz::value::texcoord3d>>>
                         (b,false);
        local_88._0_16_ = ZEXT816(0);
        local_88.b = 0.0;
        bVar5 = b_47 != (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                         *)0x0 &&
                a_58 != (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                         *)0x0;
        if (b_47 != (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                     *)0x0 &&
            a_58 != (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                     *)0x0) {
          lerp<tinyusdz::value::texcoord3d>
                    ((vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                      *)&local_58,a_58,b_47,local_60);
          dVar4 = local_88.b;
          dVar2 = local_88.r;
          local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish;
          local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start;
          local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage;
          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if ((color4h)dVar2 != (color4h)0x0) {
            operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
          }
          if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_58.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_58.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          linb::any::operator=
                    ((any *)&local_40,
                     (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                      *)&local_88);
        }
        break;
      default:
        bVar5 = false;
        goto LAB_002c7237;
      }
      goto LAB_002c7221;
    }
    break;
  case 0x11:
    a_08 = Value::as<std::array<tinyusdz::value::half,2ul>>(a,false);
    b_06 = Value::as<std::array<tinyusdz::value::half,2ul>>(b,false);
    bVar5 = b_06 != (array<tinyusdz::value::half,_2UL> *)0x0 &&
            a_08 != (array<tinyusdz::value::half,_2UL> *)0x0;
    if (b_06 != (array<tinyusdz::value::half,_2UL> *)0x0 &&
        a_08 != (array<tinyusdz::value::half,_2UL> *)0x0) {
      hVar9 = lerp<std::array<tinyusdz::value::half,2ul>>(a_08,b_06,local_60);
      local_88.r._0_2_ = hVar9._M_elems[0].value;
      local_88.r._2_2_ = hVar9._M_elems[1].value;
      linb::any::operator=((any *)&local_40,(array<tinyusdz::value::half,_2UL> *)&local_88);
    }
    break;
  case 0x12:
    a_09 = Value::as<std::array<tinyusdz::value::half,3ul>>(a,false);
    b_07 = Value::as<std::array<tinyusdz::value::half,3ul>>(b,false);
    bVar5 = b_07 != (array<tinyusdz::value::half,_3UL> *)0x0 &&
            a_09 != (array<tinyusdz::value::half,_3UL> *)0x0;
    if (b_07 != (array<tinyusdz::value::half,_3UL> *)0x0 &&
        a_09 != (array<tinyusdz::value::half,_3UL> *)0x0) {
      hVar11 = lerp<std::array<tinyusdz::value::half,3ul>>(a_09,b_07,local_60);
      local_88.r._0_2_ = hVar11._M_elems[0].value;
      local_88.r._2_2_ = hVar11._M_elems[1].value;
      local_88.r._4_2_ = hVar11._M_elems[2].value;
      linb::any::operator=((any *)&local_40,(array<tinyusdz::value::half,_3UL> *)&local_88);
    }
    break;
  case 0x13:
    a_05 = Value::as<std::array<tinyusdz::value::half,4ul>>(a,false);
    b_05 = Value::as<std::array<tinyusdz::value::half,4ul>>(b,false);
    bVar5 = b_05 != (array<tinyusdz::value::half,_4UL> *)0x0 &&
            a_05 != (array<tinyusdz::value::half,_4UL> *)0x0;
    if (b_05 != (array<tinyusdz::value::half,_4UL> *)0x0 &&
        a_05 != (array<tinyusdz::value::half,_4UL> *)0x0) {
      local_88.r = (double)lerp<std::array<tinyusdz::value::half,4ul>>(a_05,b_05,local_60);
      linb::any::operator=((any *)&local_40,(array<tinyusdz::value::half,_4UL> *)&local_88);
    }
    break;
  case 0x28:
    pfVar31 = Value::as<float>(a,false);
    pfVar32 = Value::as<float>(b,false);
    bVar5 = pfVar32 != (float *)0x0 && pfVar31 != (float *)0x0;
    if (pfVar32 != (float *)0x0 && pfVar31 != (float *)0x0) {
      local_88.r._0_4_ =
           (texcoord2h)((float)(1.0 - local_60) * *pfVar31 + (float)local_60 * *pfVar32);
      linb::any::operator=((any *)&local_40,(float *)&local_88);
    }
    break;
  case 0x29:
    paVar27 = Value::as<std::array<float,2ul>>(a,false);
    paVar28 = Value::as<std::array<float,2ul>>(b,false);
    auVar3 = (undefined1  [16])local_88._0_16_;
    bVar5 = paVar28 != (array<float,_2UL> *)0x0 && paVar27 != (array<float,_2UL> *)0x0;
    if (paVar28 != (array<float,_2UL> *)0x0 && paVar27 != (array<float,_2UL> *)0x0) {
      local_88.r._4_4_ =
           (float)local_60 * paVar28->_M_elems[1] + (float)(1.0 - local_60) * paVar27->_M_elems[1];
      local_88.r._0_4_ =
           (texcoord2h)
           (paVar28->_M_elems[0] * (float)local_60 + paVar27->_M_elems[0] * (float)(1.0 - local_60))
      ;
      local_88.g = auVar3._8_8_;
      linb::any::operator=((any *)&local_40,(array<float,_2UL> *)&local_88);
    }
    break;
  case 0x2a:
    a_15 = Value::as<std::array<float,3ul>>(a,false);
    b_13 = Value::as<std::array<float,3ul>>(b,false);
    bVar5 = b_13 != (array<float,_3UL> *)0x0 && a_15 != (array<float,_3UL> *)0x0;
    if (b_13 != (array<float,_3UL> *)0x0 && a_15 != (array<float,_3UL> *)0x0) {
      fVar44 = lerp<std::array<float,3ul>>(a_15,b_13,local_60);
      local_88.r._0_4_ = (texcoord2h)fVar44._M_elems[0];
      local_88.r._4_4_ = fVar44._M_elems[1];
      local_88.g._0_4_ = fVar44._M_elems[2];
      linb::any::operator=((any *)&local_40,(array<float,_3UL> *)&local_88);
    }
    break;
  case 0x2b:
    a_12 = Value::as<std::array<float,4ul>>(a,false);
    b_10 = Value::as<std::array<float,4ul>>(b,false);
    bVar5 = b_10 != (array<float,_4UL> *)0x0 && a_12 != (array<float,_4UL> *)0x0;
    if (b_10 != (array<float,_4UL> *)0x0 && a_12 != (array<float,_4UL> *)0x0) {
      local_88._0_16_ = lerp<std::array<float,4ul>>(a_12,b_10,local_60);
      linb::any::operator=((any *)&local_40,(array<float,_4UL> *)&local_88);
    }
    break;
  case 0x2c:
    pdVar33 = Value::as<double>(a,false);
    pdVar34 = Value::as<double>(b,false);
    bVar5 = pdVar34 != (double *)0x0 && pdVar33 != (double *)0x0;
    if (pdVar34 != (double *)0x0 && pdVar33 != (double *)0x0) {
      local_88.r = (1.0 - local_60) * *pdVar33 + local_60 * *pdVar34;
      linb::any::operator=((any *)&local_40,&local_88.r);
    }
    break;
  case 0x2d:
    paVar21 = Value::as<std::array<double,2ul>>(a,false);
    paVar22 = Value::as<std::array<double,2ul>>(b,false);
    bVar5 = paVar22 != (array<double,_2UL> *)0x0 && paVar21 != (array<double,_2UL> *)0x0;
    if (paVar22 != (array<double,_2UL> *)0x0 && paVar21 != (array<double,_2UL> *)0x0) {
      local_88.g = local_60 * paVar22->_M_elems[1] + (1.0 - local_60) * paVar21->_M_elems[1];
      local_88.r = paVar22->_M_elems[0] * local_60 + paVar21->_M_elems[0] * (1.0 - local_60);
      linb::any::operator=((any *)&local_40,(array<double,_2UL> *)&local_88);
    }
    break;
  case 0x2e:
    paVar29 = Value::as<std::array<double,3ul>>(a,false);
    paVar30 = Value::as<std::array<double,3ul>>(b,false);
    bVar5 = paVar30 != (array<double,_3UL> *)0x0 && paVar29 != (array<double,_3UL> *)0x0;
    if (paVar30 != (array<double,_3UL> *)0x0 && paVar29 != (array<double,_3UL> *)0x0) {
      dVar2 = 1.0 - local_60;
      local_88.b = local_60 * paVar30->_M_elems[2] + dVar2 * paVar29->_M_elems[2];
      local_88.g = paVar30->_M_elems[1] * local_60 + paVar29->_M_elems[1] * dVar2;
      local_88.r = paVar30->_M_elems[0] * local_60 + paVar29->_M_elems[0] * dVar2;
      linb::any::operator=((any *)&local_40,(array<double,_3UL> *)&local_88);
    }
    break;
  case 0x2f:
    ptVar35 = (tinyusdz *)Value::as<std::array<double,4ul>>(a,false);
    a_07 = Value::as<std::array<double,4ul>>(b,false);
    bVar43 = ptVar35 != (tinyusdz *)0x0;
    bVar5 = a_07 != (array<double,_4UL> *)0x0 && bVar43;
    if (a_07 != (array<double,_4UL> *)0x0 && bVar43) {
      lerp<std::array<double,4ul>>
                ((double4 *)&local_88,ptVar35,a_07,
                 (double4 *)CONCAT71((int7)((ulong)puVar42 >> 8),bVar43),local_60);
      linb::any::operator=((any *)&local_40,(array<double,_4UL> *)&local_88);
    }
    break;
  case 0x30:
    this = Value::as<tinyusdz::value::quath>(a,false);
    a_06 = Value::as<tinyusdz::value::quath>(b,false);
    bVar5 = a_06 != (quath *)0x0 && this != (quath *)0x0;
    if (a_06 != (quath *)0x0 && this != (quath *)0x0) {
      local_88.r = (double)lerp<tinyusdz::value::quath>((tinyusdz *)this,a_06,b_49,local_60);
      linb::any::operator=((any *)&local_40,(quath *)&local_88);
    }
    break;
  case 0x31:
    a_03 = Value::as<tinyusdz::value::quatf>(a,false);
    b_03 = Value::as<tinyusdz::value::quatf>(b,false);
    bVar5 = b_03 != (quatf *)0x0 && a_03 != (quatf *)0x0;
    if (b_03 != (quatf *)0x0 && a_03 != (quatf *)0x0) {
      local_88._0_16_ = slerp(a_03,b_03,(float)local_60);
      linb::any::operator=((any *)&local_40,(quatf *)&local_88);
    }
    break;
  case 0x32:
    a_16 = Value::as<tinyusdz::value::quatd>(a,false);
    b_14 = Value::as<tinyusdz::value::quatd>(b,false);
    bVar5 = b_14 != (quatd *)0x0 && a_16 != (quatd *)0x0;
    if (b_14 != (quatd *)0x0 && a_16 != (quatd *)0x0) {
      slerp((quatd *)&local_88,a_16,b_14,local_60);
      linb::any::operator=((any *)&local_40,(quatd *)&local_88);
    }
    break;
  case 0x39:
    a_20 = Value::as<tinyusdz::value::color3h>(a,false);
    b_18 = Value::as<tinyusdz::value::color3h>(b,false);
    bVar5 = b_18 != (color3h *)0x0 && a_20 != (color3h *)0x0;
    if (b_18 != (color3h *)0x0 && a_20 != (color3h *)0x0) {
      cVar14 = lerp<tinyusdz::value::color3h>(a_20,b_18,local_60);
      local_88.r._0_6_ = cVar14;
      linb::any::operator=((any *)&local_40,(color3h *)&local_88);
    }
    break;
  case 0x3a:
    a_21 = Value::as<tinyusdz::value::color3f>(a,false);
    b_19 = Value::as<tinyusdz::value::color3f>(b,false);
    bVar5 = b_19 != (color3f *)0x0 && a_21 != (color3f *)0x0;
    if (b_19 != (color3f *)0x0 && a_21 != (color3f *)0x0) {
      local_88._0_12_ = lerp<tinyusdz::value::color3f>(a_21,b_19,local_60);
      linb::any::operator=((any *)&local_40,(color3f *)&local_88);
    }
    break;
  case 0x3b:
    pcVar36 = Value::as<tinyusdz::value::color3d>(a,false);
    pcVar37 = Value::as<tinyusdz::value::color3d>(b,false);
    bVar5 = pcVar37 != (color3d *)0x0 && pcVar36 != (color3d *)0x0;
    if (pcVar37 != (color3d *)0x0 && pcVar36 != (color3d *)0x0) {
      dVar2 = 1.0 - local_60;
      local_88.b = local_60 * pcVar37->b + dVar2 * pcVar36->b;
      local_88.g = pcVar37->g * local_60 + pcVar36->g * dVar2;
      local_88.r = pcVar37->r * local_60 + pcVar36->r * dVar2;
      linb::any::operator=((any *)&local_40,(color3d *)&local_88);
    }
    break;
  case 0x3c:
    a_19 = Value::as<tinyusdz::value::color4h>(a,false);
    b_17 = Value::as<tinyusdz::value::color4h>(b,false);
    bVar5 = b_17 != (color4h *)0x0 && a_19 != (color4h *)0x0;
    if (b_17 != (color4h *)0x0 && a_19 != (color4h *)0x0) {
      local_88.r = (double)lerp<tinyusdz::value::color4h>(a_19,b_17,local_60);
      linb::any::operator=((any *)&local_40,(color4h *)&local_88);
    }
    break;
  case 0x3d:
    a_04 = Value::as<tinyusdz::value::color4f>(a,false);
    b_04 = Value::as<tinyusdz::value::color4f>(b,false);
    bVar5 = b_04 != (color4f *)0x0 && a_04 != (color4f *)0x0;
    if (b_04 != (color4f *)0x0 && a_04 != (color4f *)0x0) {
      local_88._0_16_ = lerp<tinyusdz::value::color4f>(a_04,b_04,local_60);
      linb::any::operator=((any *)&local_40,(color4f *)&local_88);
    }
    break;
  case 0x3e:
    a_18 = Value::as<tinyusdz::value::color4d>(a,false);
    b_16 = Value::as<tinyusdz::value::color4d>(b,false);
    bVar5 = b_16 != (color4d *)0x0 && a_18 != (color4d *)0x0;
    if (b_16 != (color4d *)0x0 && a_18 != (color4d *)0x0) {
      lerp<tinyusdz::value::color4d>(&local_88,a_18,b_16,local_60);
      linb::any::operator=((any *)&local_40,&local_88);
    }
    break;
  case 0x3f:
    a_13 = Value::as<tinyusdz::value::point3h>(a,false);
    b_11 = Value::as<tinyusdz::value::point3h>(b,false);
    bVar5 = b_11 != (point3h *)0x0 && a_13 != (point3h *)0x0;
    if (b_11 != (point3h *)0x0 && a_13 != (point3h *)0x0) {
      pVar12 = lerp<tinyusdz::value::point3h>(a_13,b_11,local_60);
      local_88.r._0_6_ = (color3h)pVar12;
      linb::any::operator=((any *)&local_40,(point3h *)&local_88);
    }
    break;
  case 0x40:
    a_14 = Value::as<tinyusdz::value::point3f>(a,false);
    b_12 = Value::as<tinyusdz::value::point3f>(b,false);
    bVar5 = b_12 != (point3f *)0x0 && a_14 != (point3f *)0x0;
    if (b_12 != (point3f *)0x0 && a_14 != (point3f *)0x0) {
      local_88._0_12_ = lerp<tinyusdz::value::point3f>(a_14,b_12,local_60);
      linb::any::operator=((any *)&local_40,(point3f *)&local_88);
    }
    break;
  case 0x41:
    ppVar17 = Value::as<tinyusdz::value::point3d>(a,false);
    ppVar18 = Value::as<tinyusdz::value::point3d>(b,false);
    bVar5 = ppVar18 != (point3d *)0x0 && ppVar17 != (point3d *)0x0;
    if (ppVar18 != (point3d *)0x0 && ppVar17 != (point3d *)0x0) {
      dVar2 = 1.0 - local_60;
      local_88.b = local_60 * ppVar18->z + dVar2 * ppVar17->z;
      local_88.g = ppVar18->y * local_60 + ppVar17->y * dVar2;
      local_88.r = ppVar18->x * local_60 + ppVar17->x * dVar2;
      linb::any::operator=((any *)&local_40,(point3d *)&local_88);
    }
    break;
  case 0x42:
    a_22 = Value::as<tinyusdz::value::normal3h>(a,false);
    b_20 = Value::as<tinyusdz::value::normal3h>(b,false);
    bVar5 = b_20 != (normal3h *)0x0 && a_22 != (normal3h *)0x0;
    if (b_20 != (normal3h *)0x0 && a_22 != (normal3h *)0x0) {
      nVar15 = lerp<tinyusdz::value::normal3h>(a_22,b_20,local_60);
      local_88.r._0_6_ = (color3h)nVar15;
      linb::any::operator=((any *)&local_40,(normal3h *)&local_88);
    }
    break;
  case 0x43:
    a_10 = Value::as<tinyusdz::value::normal3f>(a,false);
    b_08 = Value::as<tinyusdz::value::normal3f>(b,false);
    bVar5 = b_08 != (normal3f *)0x0 && a_10 != (normal3f *)0x0;
    if (b_08 != (normal3f *)0x0 && a_10 != (normal3f *)0x0) {
      local_88._0_12_ = lerp<tinyusdz::value::normal3f>(a_10,b_08,local_60);
      linb::any::operator=((any *)&local_40,(normal3f *)&local_88);
    }
    break;
  case 0x44:
    pnVar25 = Value::as<tinyusdz::value::normal3d>(a,false);
    pnVar26 = Value::as<tinyusdz::value::normal3d>(b,false);
    bVar5 = pnVar26 != (normal3d *)0x0 && pnVar25 != (normal3d *)0x0;
    if (pnVar26 != (normal3d *)0x0 && pnVar25 != (normal3d *)0x0) {
      dVar2 = 1.0 - local_60;
      local_88.b = local_60 * pnVar26->z + dVar2 * pnVar25->z;
      local_88.g = pnVar26->y * local_60 + pnVar25->y * dVar2;
      local_88.r = pnVar26->x * local_60 + pnVar25->x * dVar2;
      linb::any::operator=((any *)&local_40,(normal3d *)&local_88);
    }
    break;
  case 0x45:
    a_17 = Value::as<tinyusdz::value::vector3h>(a,false);
    b_15 = Value::as<tinyusdz::value::vector3h>(b,false);
    bVar5 = b_15 != (vector3h *)0x0 && a_17 != (vector3h *)0x0;
    if (b_15 != (vector3h *)0x0 && a_17 != (vector3h *)0x0) {
      vVar13 = lerp<tinyusdz::value::vector3h>(a_17,b_15,local_60);
      local_88.r._0_6_ = (color3h)vVar13;
      linb::any::operator=((any *)&local_40,(vector3h *)&local_88);
    }
    break;
  case 0x46:
    a_02 = Value::as<tinyusdz::value::vector3f>(a,false);
    b_02 = Value::as<tinyusdz::value::vector3f>(b,false);
    bVar5 = b_02 != (vector3f *)0x0 && a_02 != (vector3f *)0x0;
    if (b_02 != (vector3f *)0x0 && a_02 != (vector3f *)0x0) {
      local_88._0_12_ = lerp<tinyusdz::value::vector3f>(a_02,b_02,local_60);
      linb::any::operator=((any *)&local_40,(vector3f *)&local_88);
    }
    break;
  case 0x47:
    pvVar23 = Value::as<tinyusdz::value::vector3d>(a,false);
    pvVar24 = Value::as<tinyusdz::value::vector3d>(b,false);
    bVar5 = pvVar24 != (vector3d *)0x0 && pvVar23 != (vector3d *)0x0;
    if (pvVar24 != (vector3d *)0x0 && pvVar23 != (vector3d *)0x0) {
      dVar2 = 1.0 - local_60;
      local_88.b = local_60 * pvVar24->z + dVar2 * pvVar23->z;
      local_88.g = pvVar24->y * local_60 + pvVar23->y * dVar2;
      local_88.r = pvVar24->x * local_60 + pvVar23->x * dVar2;
      linb::any::operator=((any *)&local_40,(vector3d *)&local_88);
    }
    break;
  case 0x49:
    a_11 = Value::as<tinyusdz::value::texcoord2h>(a,false);
    b_09 = Value::as<tinyusdz::value::texcoord2h>(b,false);
    bVar5 = b_09 != (texcoord2h *)0x0 && a_11 != (texcoord2h *)0x0;
    if (b_09 != (texcoord2h *)0x0 && a_11 != (texcoord2h *)0x0) {
      tVar10 = lerp<tinyusdz::value::texcoord2h>(a_11,b_09,local_60);
      local_88.r._0_4_ = tVar10;
      linb::any::operator=((any *)&local_40,(texcoord2h *)&local_88);
    }
    break;
  case 0x4a:
    ptVar19 = Value::as<tinyusdz::value::texcoord2f>(a,false);
    ptVar20 = Value::as<tinyusdz::value::texcoord2f>(b,false);
    auVar3 = (undefined1  [16])local_88._0_16_;
    bVar5 = ptVar20 != (texcoord2f *)0x0 && ptVar19 != (texcoord2f *)0x0;
    if (ptVar20 != (texcoord2f *)0x0 && ptVar19 != (texcoord2f *)0x0) {
      local_88.r._4_4_ = (float)local_60 * ptVar20->t + (float)(1.0 - local_60) * ptVar19->t;
      local_88.r._0_4_ =
           (texcoord2h)(ptVar20->s * (float)local_60 + ptVar19->s * (float)(1.0 - local_60));
      local_88.g = auVar3._8_8_;
      linb::any::operator=((any *)&local_40,(texcoord2f *)&local_88);
    }
    break;
  default:
    puVar42 = &switchD_002c4d37::switchdataD_00435d1c;
    switch(uVar7) {
    case 0x10000e:
      a_01 = Value::as<std::vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>>>
                       (a,false);
      b_01 = Value::as<std::vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>>>
                       (b,false);
      local_88._0_16_ = ZEXT816(0);
      local_88.b = 0.0;
      bVar5 = b_01 != (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)0x0
              && a_01 != (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                         0x0;
      if (b_01 != (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)0x0 &&
          a_01 != (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)0x0) {
        lerp<tinyusdz::value::half>
                  ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                   &local_58,a_01,b_01,local_60);
        dVar4 = local_88.b;
        dVar2 = local_88.r;
        local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if ((color4h)dVar2 != (color4h)0x0) {
          operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
        }
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        linb::any::operator=
                  ((any *)&local_40,
                   (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                   &local_88);
      }
      break;
    default:
      goto LAB_002c726f;
    case 0x100011:
      ptVar35 = (tinyusdz *)
                Value::
                as<std::vector<std::array<tinyusdz::value::half,2ul>,std::allocator<std::array<tinyusdz::value::half,2ul>>>>
                          (a,false);
      a_39 = Value::
             as<std::vector<std::array<tinyusdz::value::half,2ul>,std::allocator<std::array<tinyusdz::value::half,2ul>>>>
                       (b,false);
      local_88._0_16_ = ZEXT816(0);
      local_88.b = 0.0;
      bVar43 = ptVar35 != (tinyusdz *)0x0;
      bVar5 = a_39 != (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                       *)0x0 && bVar43;
      if (a_39 != (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                   *)0x0 && bVar43) {
        lerp<std::array<tinyusdz::value::half,2ul>>
                  ((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                    *)&local_58,ptVar35,a_39,
                   (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                    *)CONCAT71((int7)((ulong)puVar42 >> 8),bVar43),local_60);
        dVar4 = local_88.b;
        dVar2 = local_88.r;
        local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if ((color4h)dVar2 != (color4h)0x0) {
          operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
        }
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        linb::any::operator=
                  ((any *)&local_40,
                   (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                    *)&local_88);
      }
      break;
    case 0x100012:
      ptVar35 = (tinyusdz *)
                Value::
                as<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                          (a,false);
      a_40 = Value::
             as<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                       (b,false);
      local_88._0_16_ = ZEXT816(0);
      local_88.b = 0.0;
      bVar43 = ptVar35 != (tinyusdz *)0x0;
      bVar5 = a_40 != (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                       *)0x0 && bVar43;
      if (a_40 != (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                   *)0x0 && bVar43) {
        lerp<std::array<tinyusdz::value::half,3ul>>
                  ((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                    *)&local_58,ptVar35,a_40,
                   (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                    *)CONCAT71((int7)((ulong)puVar42 >> 8),bVar43),local_60);
        dVar4 = local_88.b;
        dVar2 = local_88.r;
        local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if ((color4h)dVar2 != (color4h)0x0) {
          operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
        }
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        linb::any::operator=
                  ((any *)&local_40,
                   (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                    *)&local_88);
      }
      break;
    case 0x100013:
      ptVar35 = (tinyusdz *)
                Value::
                as<std::vector<std::array<tinyusdz::value::half,4ul>,std::allocator<std::array<tinyusdz::value::half,4ul>>>>
                          (a,false);
      a_31 = Value::
             as<std::vector<std::array<tinyusdz::value::half,4ul>,std::allocator<std::array<tinyusdz::value::half,4ul>>>>
                       (b,false);
      local_88._0_16_ = ZEXT816(0);
      local_88.b = 0.0;
      bVar43 = ptVar35 != (tinyusdz *)0x0;
      bVar5 = a_31 != (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                       *)0x0 && bVar43;
      if (a_31 != (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                   *)0x0 && bVar43) {
        lerp<std::array<tinyusdz::value::half,4ul>>
                  ((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                    *)&local_58,ptVar35,a_31,
                   (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                    *)CONCAT71((int7)((ulong)puVar42 >> 8),bVar43),local_60);
        dVar4 = local_88.b;
        dVar2 = local_88.r;
        local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if ((color4h)dVar2 != (color4h)0x0) {
          operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
        }
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        linb::any::operator=
                  ((any *)&local_40,
                   (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                    *)&local_88);
      }
      break;
    case 0x100028:
      a_36 = Value::as<std::vector<float,std::allocator<float>>>(a,false);
      b_30 = Value::as<std::vector<float,std::allocator<float>>>(b,false);
      local_88._0_16_ = ZEXT816(0);
      local_88.b = 0.0;
      bVar5 = b_30 != (vector<float,_std::allocator<float>_> *)0x0 &&
              a_36 != (vector<float,_std::allocator<float>_> *)0x0;
      if (b_30 != (vector<float,_std::allocator<float>_> *)0x0 &&
          a_36 != (vector<float,_std::allocator<float>_> *)0x0) {
        lerp<float>((vector<float,_std::allocator<float>_> *)&local_58,a_36,b_30,local_60);
        dVar4 = local_88.b;
        dVar2 = local_88.r;
        local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if ((color4h)dVar2 != (color4h)0x0) {
          operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
        }
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        linb::any::operator=((any *)&local_40,(vector<float,_std::allocator<float>_> *)&local_88);
      }
      break;
    case 0x100029:
      ptVar35 = (tinyusdz *)
                Value::as<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>
                          (a,false);
      a_33 = Value::as<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>
                       (b,false);
      local_88._0_16_ = ZEXT816(0);
      local_88.b = 0.0;
      bVar43 = ptVar35 != (tinyusdz *)0x0;
      bVar5 = a_33 != (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                      0x0 && bVar43;
      if (a_33 != (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)0x0 &&
          bVar43) {
        lerp<std::array<float,2ul>>
                  ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                   &local_58,ptVar35,a_33,
                   (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                   CONCAT71((int7)((ulong)puVar42 >> 8),bVar43),local_60);
        dVar4 = local_88.b;
        dVar2 = local_88.r;
        local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if ((color4h)dVar2 != (color4h)0x0) {
          operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
        }
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        linb::any::operator=
                  ((any *)&local_40,
                   (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                   &local_88);
      }
      break;
    case 0x10002a:
      ptVar35 = (tinyusdz *)
                Value::as<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                          (a,false);
      a_46 = Value::as<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                       (b,false);
      local_88._0_16_ = ZEXT816(0);
      local_88.b = 0.0;
      bVar43 = ptVar35 != (tinyusdz *)0x0;
      bVar5 = a_46 != (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                      0x0 && bVar43;
      if (a_46 != (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)0x0 &&
          bVar43) {
        lerp<std::array<float,3ul>>
                  ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                   &local_58,ptVar35,a_46,
                   (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                   CONCAT71((int7)((ulong)puVar42 >> 8),bVar43),local_60);
        dVar4 = local_88.b;
        dVar2 = local_88.r;
        local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if ((color4h)dVar2 != (color4h)0x0) {
          operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
        }
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        linb::any::operator=
                  ((any *)&local_40,
                   (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                   &local_88);
      }
      break;
    case 0x10002b:
      ptVar35 = (tinyusdz *)
                Value::as<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                          (a,false);
      a_43 = Value::as<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                       (b,false);
      local_88._0_16_ = ZEXT816(0);
      local_88.b = 0.0;
      bVar43 = ptVar35 != (tinyusdz *)0x0;
      bVar5 = a_43 != (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                      0x0 && bVar43;
      if (a_43 != (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)0x0 &&
          bVar43) {
        lerp<std::array<float,4ul>>
                  ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                   &local_58,ptVar35,a_43,
                   (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                   CONCAT71((int7)((ulong)puVar42 >> 8),bVar43),local_60);
        dVar4 = local_88.b;
        dVar2 = local_88.r;
        local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if ((color4h)dVar2 != (color4h)0x0) {
          operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
        }
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        linb::any::operator=
                  ((any *)&local_40,
                   (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                   &local_88);
      }
      break;
    case 0x10002c:
      a_37 = Value::as<std::vector<double,std::allocator<double>>>(a,false);
      b_31 = Value::as<std::vector<double,std::allocator<double>>>(b,false);
      local_88._0_16_ = ZEXT816(0);
      local_88.b = 0.0;
      bVar5 = b_31 != (vector<double,_std::allocator<double>_> *)0x0 &&
              a_37 != (vector<double,_std::allocator<double>_> *)0x0;
      if (b_31 != (vector<double,_std::allocator<double>_> *)0x0 &&
          a_37 != (vector<double,_std::allocator<double>_> *)0x0) {
        lerp<double>(&local_58,a_37,b_31,local_60);
        dVar4 = local_88.b;
        dVar2 = local_88.r;
        local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if ((color4h)dVar2 != (color4h)0x0) {
          operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
        }
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        linb::any::operator=((any *)&local_40,(vector<double,_std::allocator<double>_> *)&local_88);
      }
      break;
    case 0x10002d:
      ptVar35 = (tinyusdz *)
                Value::
                as<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
                          (a,false);
      a_27 = Value::as<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
                       (b,false);
      local_88._0_16_ = ZEXT816(0);
      local_88.b = 0.0;
      bVar43 = ptVar35 != (tinyusdz *)0x0;
      bVar5 = a_27 != (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                      0x0 && bVar43;
      if (a_27 != (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)0x0
          && bVar43) {
        lerp<std::array<double,2ul>>
                  ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                   &local_58,ptVar35,a_27,
                   (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                   CONCAT71((int7)((ulong)puVar42 >> 8),bVar43),local_60);
        dVar4 = local_88.b;
        dVar2 = local_88.r;
        local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if ((color4h)dVar2 != (color4h)0x0) {
          operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
        }
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        linb::any::operator=
                  ((any *)&local_40,
                   (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                   &local_88);
      }
      break;
    case 0x10002e:
      ptVar35 = (tinyusdz *)
                Value::
                as<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
                          (a,false);
      a_34 = Value::as<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
                       (b,false);
      local_88._0_16_ = ZEXT816(0);
      local_88.b = 0.0;
      bVar43 = ptVar35 != (tinyusdz *)0x0;
      bVar5 = a_34 != (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                      0x0 && bVar43;
      if (a_34 != (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)0x0
          && bVar43) {
        lerp<std::array<double,3ul>>
                  ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                   &local_58,ptVar35,a_34,
                   (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                   CONCAT71((int7)((ulong)puVar42 >> 8),bVar43),local_60);
        dVar4 = local_88.b;
        dVar2 = local_88.r;
        local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if ((color4h)dVar2 != (color4h)0x0) {
          operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
        }
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        linb::any::operator=
                  ((any *)&local_40,
                   (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                   &local_88);
      }
      break;
    case 0x10002f:
      ptVar35 = (tinyusdz *)
                Value::
                as<std::vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>>>
                          (a,false);
      a_38 = Value::as<std::vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>>>
                       (b,false);
      local_88._0_16_ = ZEXT816(0);
      local_88.b = 0.0;
      bVar43 = ptVar35 != (tinyusdz *)0x0;
      bVar5 = a_38 != (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                      0x0 && bVar43;
      if (a_38 != (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)0x0
          && bVar43) {
        lerp<std::array<double,4ul>>
                  ((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                   &local_58,ptVar35,a_38,
                   (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                   CONCAT71((int7)((ulong)puVar42 >> 8),bVar43),local_60);
        dVar4 = local_88.b;
        dVar2 = local_88.r;
        local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if ((color4h)dVar2 != (color4h)0x0) {
          operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
        }
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        linb::any::operator=
                  ((any *)&local_40,
                   (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                   &local_88);
      }
      break;
    case 0x100030:
      a_35 = Value::as<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
                       (a,false);
      b_29 = Value::as<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
                       (b,false);
      local_88._0_16_ = ZEXT816(0);
      local_88.b = 0.0;
      bVar5 = b_29 != (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)0x0
              && a_35 != (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                         0x0;
      if (b_29 != (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)0x0 &&
          a_35 != (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)0x0) {
        lerp<tinyusdz::value::quath>
                  ((vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                   &local_58,a_35,b_29,local_60);
        dVar4 = local_88.b;
        dVar2 = local_88.r;
        local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if ((color4h)dVar2 != (color4h)0x0) {
          operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
        }
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        linb::any::operator=
                  ((any *)&local_40,
                   (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                   &local_88);
      }
      break;
    case 0x100031:
      a_28 = Value::as<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
                       (a,false);
      b_25 = Value::as<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
                       (b,false);
      local_88._0_16_ = ZEXT816(0);
      local_88.b = 0.0;
      bVar5 = b_25 != (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)0x0
              && a_28 != (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                         0x0;
      if (b_25 != (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)0x0 &&
          a_28 != (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)0x0) {
        lerp<tinyusdz::value::quatf>
                  ((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                   &local_58,a_28,b_25,local_60);
        dVar4 = local_88.b;
        dVar2 = local_88.r;
        local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if ((color4h)dVar2 != (color4h)0x0) {
          operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
        }
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        linb::any::operator=
                  ((any *)&local_40,
                   (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                   &local_88);
      }
      break;
    case 0x100032:
      a_47 = Value::as<std::vector<tinyusdz::value::quatd,std::allocator<tinyusdz::value::quatd>>>
                       (a,false);
      b_36 = Value::as<std::vector<tinyusdz::value::quatd,std::allocator<tinyusdz::value::quatd>>>
                       (b,false);
      local_88._0_16_ = ZEXT816(0);
      local_88.b = 0.0;
      bVar5 = b_36 != (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)0x0
              && a_47 != (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                         0x0;
      if (b_36 != (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)0x0 &&
          a_47 != (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)0x0) {
        lerp<tinyusdz::value::quatd>
                  ((vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                   &local_58,a_47,b_36,local_60);
        dVar4 = local_88.b;
        dVar2 = local_88.r;
        local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if ((color4h)dVar2 != (color4h)0x0) {
          operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
        }
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        linb::any::operator=
                  ((any *)&local_40,
                   (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                   &local_88);
      }
      break;
    case 0x100039:
      a_52 = Value::
             as<std::vector<tinyusdz::value::color3h,std::allocator<tinyusdz::value::color3h>>>
                       (a,false);
      b_41 = Value::
             as<std::vector<tinyusdz::value::color3h,std::allocator<tinyusdz::value::color3h>>>
                       (b,false);
      local_88._0_16_ = ZEXT816(0);
      local_88.b = 0.0;
      bVar5 = b_41 != (vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> *
                      )0x0 &&
              a_52 != (vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> *
                      )0x0;
      if (b_41 != (vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> *)0x0
          && a_52 != (vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> *)
                     0x0) {
        lerp<tinyusdz::value::color3h>
                  ((vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> *)
                   &local_58,a_52,b_41,local_60);
        dVar4 = local_88.b;
        dVar2 = local_88.r;
        local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if ((color4h)dVar2 != (color4h)0x0) {
          operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
        }
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        linb::any::operator=
                  ((any *)&local_40,
                   (vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> *)
                   &local_88);
      }
      break;
    case 0x10003a:
      a_53 = Value::
             as<std::vector<tinyusdz::value::color3f,std::allocator<tinyusdz::value::color3f>>>
                       (a,false);
      b_42 = Value::
             as<std::vector<tinyusdz::value::color3f,std::allocator<tinyusdz::value::color3f>>>
                       (b,false);
      local_88._0_16_ = ZEXT816(0);
      local_88.b = 0.0;
      bVar5 = b_42 != (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *
                      )0x0 &&
              a_53 != (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *
                      )0x0;
      if (b_42 != (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)0x0
          && a_53 != (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                     0x0) {
        lerp<tinyusdz::value::color3f>
                  ((vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                   &local_58,a_53,b_42,local_60);
        dVar4 = local_88.b;
        dVar2 = local_88.r;
        local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if ((color4h)dVar2 != (color4h)0x0) {
          operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
        }
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        linb::any::operator=
                  ((any *)&local_40,
                   (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                   &local_88);
      }
      break;
    case 0x10003b:
      a_48 = Value::
             as<std::vector<tinyusdz::value::color3d,std::allocator<tinyusdz::value::color3d>>>
                       (a,false);
      b_37 = Value::
             as<std::vector<tinyusdz::value::color3d,std::allocator<tinyusdz::value::color3d>>>
                       (b,false);
      local_88._0_16_ = ZEXT816(0);
      local_88.b = 0.0;
      bVar5 = b_37 != (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *
                      )0x0 &&
              a_48 != (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *
                      )0x0;
      if (b_37 != (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)0x0
          && a_48 != (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                     0x0) {
        lerp<tinyusdz::value::color3d>
                  ((vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                   &local_58,a_48,b_37,local_60);
        dVar4 = local_88.b;
        dVar2 = local_88.r;
        local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if ((color4h)dVar2 != (color4h)0x0) {
          operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
        }
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        linb::any::operator=
                  ((any *)&local_40,
                   (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                   &local_88);
      }
      break;
    case 0x10003c:
      a_51 = Value::
             as<std::vector<tinyusdz::value::color4h,std::allocator<tinyusdz::value::color4h>>>
                       (a,false);
      b_40 = Value::
             as<std::vector<tinyusdz::value::color4h,std::allocator<tinyusdz::value::color4h>>>
                       (b,false);
      local_88._0_16_ = ZEXT816(0);
      local_88.b = 0.0;
      bVar5 = b_40 != (vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *
                      )0x0 &&
              a_51 != (vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *
                      )0x0;
      if (b_40 != (vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *)0x0
          && a_51 != (vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *)
                     0x0) {
        lerp<tinyusdz::value::color4h>
                  ((vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *)
                   &local_58,a_51,b_40,local_60);
        dVar4 = local_88.b;
        dVar2 = local_88.r;
        local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if ((color4h)dVar2 != (color4h)0x0) {
          operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
        }
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        linb::any::operator=
                  ((any *)&local_40,
                   (vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *)
                   &local_88);
      }
      break;
    case 0x10003d:
      a_29 = Value::
             as<std::vector<tinyusdz::value::color4f,std::allocator<tinyusdz::value::color4f>>>
                       (a,false);
      b_26 = Value::
             as<std::vector<tinyusdz::value::color4f,std::allocator<tinyusdz::value::color4f>>>
                       (b,false);
      local_88._0_16_ = ZEXT816(0);
      local_88.b = 0.0;
      bVar5 = b_26 != (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *
                      )0x0 &&
              a_29 != (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *
                      )0x0;
      if (b_26 != (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)0x0
          && a_29 != (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                     0x0) {
        lerp<tinyusdz::value::color4f>
                  ((vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                   &local_58,a_29,b_26,local_60);
        dVar4 = local_88.b;
        dVar2 = local_88.r;
        local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if ((color4h)dVar2 != (color4h)0x0) {
          operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
        }
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        linb::any::operator=
                  ((any *)&local_40,
                   (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                   &local_88);
      }
      break;
    case 0x10003e:
      a_50 = Value::
             as<std::vector<tinyusdz::value::color4d,std::allocator<tinyusdz::value::color4d>>>
                       (a,false);
      b_39 = Value::
             as<std::vector<tinyusdz::value::color4d,std::allocator<tinyusdz::value::color4d>>>
                       (b,false);
      local_88._0_16_ = ZEXT816(0);
      local_88.b = 0.0;
      bVar5 = b_39 != (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *
                      )0x0 &&
              a_50 != (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *
                      )0x0;
      if (b_39 != (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)0x0
          && a_50 != (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                     0x0) {
        lerp<tinyusdz::value::color4d>
                  ((vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                   &local_58,a_50,b_39,local_60);
        dVar4 = local_88.b;
        dVar2 = local_88.r;
        local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if ((color4h)dVar2 != (color4h)0x0) {
          operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
        }
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        linb::any::operator=
                  ((any *)&local_40,
                   (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                   &local_88);
      }
      break;
    case 0x10003f:
      a_44 = Value::
             as<std::vector<tinyusdz::value::point3h,std::allocator<tinyusdz::value::point3h>>>
                       (a,false);
      b_34 = Value::
             as<std::vector<tinyusdz::value::point3h,std::allocator<tinyusdz::value::point3h>>>
                       (b,false);
      local_88._0_16_ = ZEXT816(0);
      local_88.b = 0.0;
      bVar5 = b_34 != (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *
                      )0x0 &&
              a_44 != (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *
                      )0x0;
      if (b_34 != (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)0x0
          && a_44 != (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                     0x0) {
        lerp<tinyusdz::value::point3h>
                  ((vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                   &local_58,a_44,b_34,local_60);
        dVar4 = local_88.b;
        dVar2 = local_88.r;
        local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if ((color4h)dVar2 != (color4h)0x0) {
          operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
        }
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        linb::any::operator=
                  ((any *)&local_40,
                   (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                   &local_88);
      }
      break;
    case 0x100040:
      a_45 = Value::
             as<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                       (a,false);
      b_35 = Value::
             as<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                       (b,false);
      local_88._0_16_ = ZEXT816(0);
      local_88.b = 0.0;
      bVar5 = b_35 != (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *
                      )0x0 &&
              a_45 != (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *
                      )0x0;
      if (b_35 != (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)0x0
          && a_45 != (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                     0x0) {
        lerp<tinyusdz::value::point3f>
                  ((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                   &local_58,a_45,b_35,local_60);
        dVar4 = local_88.b;
        dVar2 = local_88.r;
        local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if ((color4h)dVar2 != (color4h)0x0) {
          operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
        }
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        linb::any::operator=
                  ((any *)&local_40,
                   (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                   &local_88);
      }
      break;
    case 0x100041:
      a_24 = Value::
             as<std::vector<tinyusdz::value::point3d,std::allocator<tinyusdz::value::point3d>>>
                       (a,false);
      b_22 = Value::
             as<std::vector<tinyusdz::value::point3d,std::allocator<tinyusdz::value::point3d>>>
                       (b,false);
      local_88._0_16_ = ZEXT816(0);
      local_88.b = 0.0;
      bVar5 = b_22 != (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *
                      )0x0 &&
              a_24 != (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *
                      )0x0;
      if (b_22 != (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)0x0
          && a_24 != (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                     0x0) {
        lerp<tinyusdz::value::point3d>
                  ((vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                   &local_58,a_24,b_22,local_60);
        dVar4 = local_88.b;
        dVar2 = local_88.r;
        local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if ((color4h)dVar2 != (color4h)0x0) {
          operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
        }
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        linb::any::operator=
                  ((any *)&local_40,
                   (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                   &local_88);
      }
      break;
    case 0x100042:
      a_54 = Value::
             as<std::vector<tinyusdz::value::normal3h,std::allocator<tinyusdz::value::normal3h>>>
                       (a,false);
      b_43 = Value::
             as<std::vector<tinyusdz::value::normal3h,std::allocator<tinyusdz::value::normal3h>>>
                       (b,false);
      local_88._0_16_ = ZEXT816(0);
      local_88.b = 0.0;
      bVar5 = b_43 != (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                       *)0x0 &&
              a_54 != (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                       *)0x0;
      if (b_43 != (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
                  0x0 &&
          a_54 != (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
                  0x0) {
        lerp<tinyusdz::value::normal3h>
                  ((vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
                   &local_58,a_54,b_43,local_60);
        dVar4 = local_88.b;
        dVar2 = local_88.r;
        local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if ((color4h)dVar2 != (color4h)0x0) {
          operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
        }
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        linb::any::operator=
                  ((any *)&local_40,
                   (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
                   &local_88);
      }
      break;
    case 0x100043:
      a_41 = Value::
             as<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                       (a,false);
      b_32 = Value::
             as<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                       (b,false);
      local_88._0_16_ = ZEXT816(0);
      local_88.b = 0.0;
      bVar5 = b_32 != (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                       *)0x0 &&
              a_41 != (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                       *)0x0;
      if (b_32 != (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                  0x0 &&
          a_41 != (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                  0x0) {
        lerp<tinyusdz::value::normal3f>
                  ((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                   &local_58,a_41,b_32,local_60);
        dVar4 = local_88.b;
        dVar2 = local_88.r;
        local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if ((color4h)dVar2 != (color4h)0x0) {
          operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
        }
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        linb::any::operator=
                  ((any *)&local_40,
                   (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                   &local_88);
      }
      break;
    case 0x100044:
      a_32 = Value::
             as<std::vector<tinyusdz::value::normal3d,std::allocator<tinyusdz::value::normal3d>>>
                       (a,false);
      b_28 = Value::
             as<std::vector<tinyusdz::value::normal3d,std::allocator<tinyusdz::value::normal3d>>>
                       (b,false);
      local_88._0_16_ = ZEXT816(0);
      local_88.b = 0.0;
      bVar5 = b_28 != (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                       *)0x0 &&
              a_32 != (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                       *)0x0;
      if (b_28 != (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)
                  0x0 &&
          a_32 != (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)
                  0x0) {
        lerp<tinyusdz::value::normal3d>
                  ((vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)
                   &local_58,a_32,b_28,local_60);
        dVar4 = local_88.b;
        dVar2 = local_88.r;
        local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if ((color4h)dVar2 != (color4h)0x0) {
          operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
        }
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        linb::any::operator=
                  ((any *)&local_40,
                   (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)
                   &local_88);
      }
      break;
    case 0x100045:
      a_49 = Value::
             as<std::vector<tinyusdz::value::vector3h,std::allocator<tinyusdz::value::vector3h>>>
                       (a,false);
      b_38 = Value::
             as<std::vector<tinyusdz::value::vector3h,std::allocator<tinyusdz::value::vector3h>>>
                       (b,false);
      local_88._0_16_ = ZEXT816(0);
      local_88.b = 0.0;
      bVar5 = b_38 != (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                       *)0x0 &&
              a_49 != (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                       *)0x0;
      if (b_38 != (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *)
                  0x0 &&
          a_49 != (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *)
                  0x0) {
        lerp<tinyusdz::value::vector3h>
                  ((vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *)
                   &local_58,a_49,b_38,local_60);
        dVar4 = local_88.b;
        dVar2 = local_88.r;
        local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if ((color4h)dVar2 != (color4h)0x0) {
          operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
        }
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        linb::any::operator=
                  ((any *)&local_40,
                   (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *)
                   &local_88);
      }
      break;
    case 0x100046:
      a_25 = Value::
             as<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                       (a,false);
      b_23 = Value::
             as<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                       (b,false);
      local_88._0_16_ = ZEXT816(0);
      local_88.b = 0.0;
      bVar5 = b_23 != (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                       *)0x0 &&
              a_25 != (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                       *)0x0;
      if (b_23 != (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                  0x0 &&
          a_25 != (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                  0x0) {
        lerp<tinyusdz::value::vector3f>
                  ((vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                   &local_58,a_25,b_23,local_60);
        dVar4 = local_88.b;
        dVar2 = local_88.r;
        local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if ((color4h)dVar2 != (color4h)0x0) {
          operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
        }
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        linb::any::operator=
                  ((any *)&local_40,
                   (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                   &local_88);
      }
      break;
    case 0x100047:
      a_30 = Value::
             as<std::vector<tinyusdz::value::vector3d,std::allocator<tinyusdz::value::vector3d>>>
                       (a,false);
      b_27 = Value::
             as<std::vector<tinyusdz::value::vector3d,std::allocator<tinyusdz::value::vector3d>>>
                       (b,false);
      local_88._0_16_ = ZEXT816(0);
      local_88.b = 0.0;
      bVar5 = b_27 != (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                       *)0x0 &&
              a_30 != (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                       *)0x0;
      if (b_27 != (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *)
                  0x0 &&
          a_30 != (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *)
                  0x0) {
        lerp<tinyusdz::value::vector3d>
                  ((vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *)
                   &local_58,a_30,b_27,local_60);
        dVar4 = local_88.b;
        dVar2 = local_88.r;
        local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if ((color4h)dVar2 != (color4h)0x0) {
          operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
        }
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        linb::any::operator=
                  ((any *)&local_40,
                   (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *)
                   &local_88);
      }
      break;
    case 0x100049:
      a_42 = Value::
             as<std::vector<tinyusdz::value::texcoord2h,std::allocator<tinyusdz::value::texcoord2h>>>
                       (a,false);
      b_33 = Value::
             as<std::vector<tinyusdz::value::texcoord2h,std::allocator<tinyusdz::value::texcoord2h>>>
                       (b,false);
      local_88._0_16_ = ZEXT816(0);
      local_88.b = 0.0;
      bVar5 = b_33 != (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                       *)0x0 &&
              a_42 != (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                       *)0x0;
      if (b_33 != (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                   *)0x0 &&
          a_42 != (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                   *)0x0) {
        lerp<tinyusdz::value::texcoord2h>
                  ((vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                    *)&local_58,a_42,b_33,local_60);
        dVar4 = local_88.b;
        dVar2 = local_88.r;
        local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if ((color4h)dVar2 != (color4h)0x0) {
          operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
        }
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        linb::any::operator=
                  ((any *)&local_40,
                   (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                    *)&local_88);
      }
      break;
    case 0x10004a:
      a_26 = Value::
             as<std::vector<tinyusdz::value::texcoord2f,std::allocator<tinyusdz::value::texcoord2f>>>
                       (a,false);
      b_24 = Value::
             as<std::vector<tinyusdz::value::texcoord2f,std::allocator<tinyusdz::value::texcoord2f>>>
                       (b,false);
      local_88._0_16_ = ZEXT816(0);
      local_88.b = 0.0;
      bVar5 = b_24 != (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                       *)0x0 &&
              a_26 != (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                       *)0x0;
      if (b_24 != (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                   *)0x0 &&
          a_26 != (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                   *)0x0) {
        lerp<tinyusdz::value::texcoord2f>
                  ((vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                    *)&local_58,a_26,b_24,local_60);
        dVar4 = local_88.b;
        dVar2 = local_88.r;
        local_88.g = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        local_88.r = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        local_88.b = (double)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if ((color4h)dVar2 != (color4h)0x0) {
          operator_delete((void *)dVar2,(long)dVar4 - (long)dVar2);
        }
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        linb::any::operator=
                  ((any *)&local_40,
                   (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                    *)&local_88);
      }
    }
LAB_002c7221:
    if ((color4h)local_88.r != (color4h)0x0) {
      operator_delete((void *)local_88.r,(long)local_88.b - (long)local_88.r);
    }
  }
LAB_002c7237:
  if (bVar5 != false) {
    linb::any::operator=(&dst->v_,(any *)&local_40);
  }
  if (local_30 != (undefined **)0x0) {
    (*(code *)local_30[4])(&local_40);
    return bVar5;
  }
  return bVar5;
}

Assistant:

bool Lerp(const value::Value &a, const value::Value &b, double dt, value::Value *dst) {
  if (!dst) {
    return false;
  }

  if (a.type_id() != b.type_id()) {
    return false;
  }

  uint32_t tyid = a.type_id();

  if (!IsLerpSupportedType(tyid)) {
    return false;
  }

  bool ok{false};
  value::Value result;

#define DO_LERP(__ty) \
  if (tyid == value::TypeTraits<__ty>::type_id()) { \
    const __ty *v0 = a.as<__ty>(); \
    const __ty *v1 = b.as<__ty>(); \
    __ty c; \
    if (v0 && v1) { \
      c = lerp(*v0, *v1, dt); \
      result = c; \
      ok = true; \
    } \
  } else if (tyid == value::TypeTraits<std::vector<__ty>>::type_id()) { \
    const std::vector<__ty> *v0 = a.as<std::vector<__ty>>(); \
    const std::vector<__ty> *v1 = b.as<std::vector<__ty>>(); \
    std::vector<__ty> c; \
    if (v0 && v1) { \
      c = lerp(*v0, *v1, dt); \
      result = c; \
      ok = true; \
    } \
  } else

  DO_LERP(value::half)
  DO_LERP(value::half2)
  DO_LERP(value::half3)
  DO_LERP(value::half4)
  DO_LERP(float)
  DO_LERP(value::float2)
  DO_LERP(value::float3)
  DO_LERP(value::float4)
  DO_LERP(double)
  DO_LERP(value::double2)
  DO_LERP(value::double3)
  DO_LERP(value::double4)
  DO_LERP(value::quath)
  DO_LERP(value::quatf)
  DO_LERP(value::quatd)
  DO_LERP(value::color3h)
  DO_LERP(value::color3f)
  DO_LERP(value::color3d)
  DO_LERP(value::color4h)
  DO_LERP(value::color4f)
  DO_LERP(value::color4d)
  DO_LERP(value::point3h)
  DO_LERP(value::point3f)
  DO_LERP(value::point3d)
  DO_LERP(value::normal3h)
  DO_LERP(value::normal3f)
  DO_LERP(value::normal3d)
  DO_LERP(value::vector3h)
  DO_LERP(value::vector3f)
  DO_LERP(value::vector3d)
  DO_LERP(value::texcoord2h)
  DO_LERP(value::texcoord2f)
  DO_LERP(value::texcoord2d)
  DO_LERP(value::texcoord3h)
  DO_LERP(value::texcoord3f)
  DO_LERP(value::texcoord3d)
  {
    DCOUT("TODO: type " << GetTypeName(tyid));
  }

#undef DO_LERP

  if (ok) {
    (*dst) = result;
  }

  return ok;
}